

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsCpp.cpp
# Opt level: O1

int __thiscall gdscpp::genDot(gdscpp *this,string *fileName)

{
  pointer pgVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  FILE *pFVar5;
  long *plVar6;
  ulong uVar7;
  ulong uVar8;
  long *plVar9;
  size_type *psVar10;
  ulong *puVar11;
  int iVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  string bashCmd;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  fromSTR;
  string lineStr;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  toSTR;
  ulong *local_120;
  char *local_118;
  ulong local_110;
  long lStack_108;
  FILE *local_100;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  char *local_b8;
  char *local_b0;
  char local_a8;
  undefined7 uStack_a7;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  string *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Generating Dot file:\"",0x15);
  local_58 = fileName;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(fileName->_M_dataplus)._M_p,fileName->_M_string_length)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\" file",6);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((this->STR).super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->STR).super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar8 = 0;
    do {
      pgVar1 = (this->STR).super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_100 = (FILE *)uVar8;
      if (*(pointer *)
           ((long)&pgVar1[uVar8].SREF.super__Vector_base<gdsSREF,_std::allocator<gdsSREF>_>._M_impl
           + 8) != *(pointer *)
                    &pgVar1[uVar8].SREF.super__Vector_base<gdsSREF,_std::allocator<gdsSREF>_>.
                     _M_impl) {
        uVar13 = 0;
        do {
          if (local_f8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              local_f8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            uVar7 = 0;
            uVar15 = 1;
            do {
              iVar3 = std::__cxx11::string::compare
                                ((string *)
                                 (local_f8.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + uVar7));
              if (iVar3 == 0) {
                iVar3 = std::__cxx11::string::compare
                                  ((string *)
                                   (local_78.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + uVar7));
                if (iVar3 == 0) goto LAB_0010a445;
              }
              bVar2 = uVar15 < (ulong)((long)local_f8.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)local_f8.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start >> 5);
              uVar7 = uVar15;
              uVar15 = (ulong)((int)uVar15 + 1);
            } while (bVar2);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_f8,
                      &(this->STR).super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar8].name);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_78,
                      (value_type *)
                      (*(long *)&(this->STR).super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>.
                                 _M_impl.super__Vector_impl_data._M_start[uVar8].SREF.
                                 super__Vector_base<gdsSREF,_std::allocator<gdsSREF>_>._M_impl +
                       uVar13 * 0x78 + 8));
LAB_0010a445:
          pgVar1 = (this->STR).super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar13 = uVar13 + 1;
          uVar7 = ((long)*(pointer *)
                          ((long)&pgVar1[uVar8].SREF.
                                  super__Vector_base<gdsSREF,_std::allocator<gdsSREF>_>._M_impl + 8)
                   - *(long *)&pgVar1[uVar8].SREF.
                               super__Vector_base<gdsSREF,_std::allocator<gdsSREF>_>._M_impl >> 3) *
                  -0x1111111111111111;
        } while (uVar13 <= uVar7 && uVar7 - uVar13 != 0);
      }
      uVar8 = (long)local_100 + 1;
      uVar13 = ((long)(this->STR).super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(this->STR).super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) * -0x1084210842108421;
    } while (uVar8 <= uVar13 && uVar13 - uVar8 != 0);
  }
  pFVar5 = fopen("foo.dot","w");
  local_b8 = &local_a8;
  local_b0 = (char *)0x0;
  local_a8 = '\0';
  std::__cxx11::string::_M_replace((ulong)&local_b8,0,(char *)0x0,0x1177ee);
  local_100 = pFVar5;
  fputs(local_b8,pFVar5);
  if (local_f8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_f8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar14 = 1;
    uVar8 = 0;
    do {
      std::operator+(&local_50,"\t",
                     local_f8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar8);
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
      plVar9 = plVar6 + 2;
      if ((long *)*plVar6 == plVar9) {
        local_88 = *plVar9;
        lStack_80 = plVar6[3];
        local_98 = &local_88;
      }
      else {
        local_88 = *plVar9;
        local_98 = (long *)*plVar6;
      }
      local_90 = plVar6[1];
      *plVar6 = (long)plVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_98,
                                  (ulong)local_78.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[uVar8].
                                         _M_dataplus._M_p);
      psVar10 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_d8.field_2._M_allocated_capacity = *psVar10;
        local_d8.field_2._8_8_ = plVar6[3];
        local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      }
      else {
        local_d8.field_2._M_allocated_capacity = *psVar10;
        local_d8._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_d8._M_string_length = plVar6[1];
      *plVar6 = (long)psVar10;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_d8);
      puVar11 = (ulong *)(plVar6 + 2);
      if ((ulong *)*plVar6 == puVar11) {
        local_110 = *puVar11;
        lStack_108 = plVar6[3];
        local_120 = &local_110;
      }
      else {
        local_110 = *puVar11;
        local_120 = (ulong *)*plVar6;
      }
      local_118 = (char *)plVar6[1];
      *plVar6 = (long)puVar11;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_b8,(string *)&local_120);
      if (local_120 != &local_110) {
        operator_delete(local_120,local_110 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      if (local_98 != &local_88) {
        operator_delete(local_98,local_88 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      fputs(local_b8,local_100);
      uVar8 = (ulong)uVar14;
      uVar14 = uVar14 + 1;
    } while (uVar8 < (ulong)((long)local_f8.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_f8.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  std::__cxx11::string::_M_replace((ulong)&local_b8,0,local_b0,0x117651);
  pFVar5 = local_100;
  fputs(local_b8,local_100);
  fclose(pFVar5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Dot file done.",0xe);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  std::ostream::flush();
  local_118 = (char *)0x0;
  local_110 = local_110 & 0xffffffffffffff00;
  local_120 = &local_110;
  std::operator+(&local_d8,"dot -Tjpg foo.dot -o ",local_58);
  std::__cxx11::string::operator=((string *)&local_120,(string *)&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  iVar3 = system((char *)local_120);
  if (iVar3 == -1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Bash command :\"",0xf)
    ;
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_120,(long)local_118);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\" error.",8);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  }
  else {
    std::__cxx11::string::_M_replace((ulong)&local_120,0,local_118,0x117847);
    iVar3 = system((char *)local_120);
    iVar12 = 0;
    if (iVar3 != -1) goto LAB_0010a8f2;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Bash command :\"",0xf)
    ;
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_120,(long)local_118);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\" error.",8);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  }
  std::ostream::put((char)poVar4);
  iVar12 = 1;
  std::ostream::flush();
LAB_0010a8f2:
  if (local_120 != &local_110) {
    operator_delete(local_120,local_110 + 1);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,CONCAT71(uStack_a7,local_a8) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_78);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_f8);
  return iVar12;
}

Assistant:

int gdscpp::genDot(const std::string &fileName)
{
  cout << "Generating Dot file:\"" << fileName << "\" file" << endl;

  vector<string> fromSTR;
  vector<string> toSTR;

  bool foundSTR;
  for (int i = 0; i < this->STR.size(); i++) {
    for (int j = 0; j < this->STR[i].SREF.size(); j++) {
      foundSTR = true;
      for (unsigned int k = 0; k < fromSTR.size(); k++) {
        if (!fromSTR[k].compare(this->STR[i].name) &&
            !toSTR[k].compare(this->STR[i].SREF[j].name)) {
          foundSTR = false;
          break;
        }
      }
      if (foundSTR) {
        fromSTR.push_back(this->STR[i].name);
        toSTR.push_back(this->STR[i].SREF[j].name);
      }
    }
  }

  // ------------------------ creating dot file ------------------------

  FILE *dotFile;
  dotFile = fopen("foo.dot", "w");

  string lineStr;

  lineStr = "digraph GDStree {\n";
  fputs(lineStr.c_str(), dotFile);

  for (unsigned int i = 0; i < fromSTR.size(); i++) {
    lineStr = "\t" + fromSTR[i] + " -> " + toSTR[i] + ";\n";
    fputs(lineStr.c_str(), dotFile);
  }

  lineStr = "}";
  fputs(lineStr.c_str(), dotFile);

  fclose(dotFile);
  cout << "Dot file done." << endl;

  // ------------------------ executing dot script ------------------------
  string bashCmd;
  bashCmd = "dot -Tjpg foo.dot -o " + fileName;

  if (system(bashCmd.c_str()) == -1) {
    cout << "Bash command :\"" << bashCmd << "\" error." << endl;
    return 1;
  }

  bashCmd = "rm foo.dot";
  if (system(bashCmd.c_str()) == -1) {
    cout << "Bash command :\"" << bashCmd << "\" error." << endl;
    return 1;
  }

  return 0;
}